

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CDirectiveFile.cpp
# Opt level: O3

bool __thiscall CDirectiveFile::Validate(CDirectiveFile *this,ValidateState *state)

{
  int iVar1;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  FileManager *this_01;
  int64_t iVar4;
  Architecture *pAVar5;
  char **in_RCX;
  AssemblerFile *__tmp;
  ErrorType type;
  shared_ptr<AssemblerFile> local_20;
  
  if (state->noFileChange == true) {
    if (*(int *)&(this->super_CAssemblerCommand).field_0x14 == 4) {
      type = 0x19081c;
    }
    else {
      type = 0x190838;
    }
    Logger::queueError<char_const*>((Logger *)0x1,type,(char *)&state->noFileChangeDirective,in_RCX)
    ;
  }
  else {
    iVar4 = FileManager::getVirtualAddress(g_fileManager);
    this->virtualAddress = iVar4;
    pAVar5 = Architecture::current();
    (*pAVar5->_vptr_Architecture[3])(pAVar5);
    this_01 = g_fileManager;
    iVar1 = *(int *)&(this->super_CAssemblerCommand).field_0x14;
    if (iVar1 - 1U < 3) {
      local_20.super___shared_ptr<AssemblerFile,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           &((this->file).super___shared_ptr<GenericAssemblerFile,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr)->super_AssemblerFile;
      local_20.super___shared_ptr<AssemblerFile,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (this->file).super___shared_ptr<GenericAssemblerFile,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
      if (local_20.super___shared_ptr<AssemblerFile,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
          != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_20.super___shared_ptr<AssemblerFile,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
          ->_M_use_count =
               (local_20.super___shared_ptr<AssemblerFile,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_20.super___shared_ptr<AssemblerFile,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
          ->_M_use_count =
               (local_20.super___shared_ptr<AssemblerFile,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi)->_M_use_count + 1;
        }
      }
      FileManager::openFile(this_01,&local_20,true);
      if (local_20.super___shared_ptr<AssemblerFile,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
          != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_20.super___shared_ptr<AssemblerFile,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
    }
    else if (iVar1 == 4) {
      peVar2 = (g_fileManager->activeFile).
               super___shared_ptr<AssemblerFile,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      p_Var3 = (g_fileManager->activeFile).
               super___shared_ptr<AssemblerFile,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
      if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
        }
      }
      (this->closeFile).super___shared_ptr<AssemblerFile,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           peVar2;
      this_00 = (this->closeFile).super___shared_ptr<AssemblerFile,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
      (this->closeFile).super___shared_ptr<AssemblerFile,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = p_Var3;
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
      }
      FileManager::closeFile(g_fileManager);
    }
  }
  return false;
}

Assistant:

bool CDirectiveFile::Validate(const ValidateState &state)
{
	if (state.noFileChange)
	{
		if (type == Type::Close)
			Logger::queueError(Logger::Error, "Cannot close file within %S", state.noFileChangeDirective);
		else
			Logger::queueError(Logger::Error, "Cannot open new file within %S", state.noFileChangeDirective);
		return false;
	}

	virtualAddress = g_fileManager->getVirtualAddress();
	Architecture::current().NextSection();

	switch (type)
	{
	case Type::Open:
	case Type::Create:
	case Type::Copy:
		g_fileManager->openFile(file,true);
		return false;
	case Type::Close:
		closeFile = g_fileManager->getOpenFile();
		g_fileManager->closeFile();
		return false;
	case Type::Invalid:
		break;
	}
	
	return false;
}